

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O0

char * Extra_StringAppend(char *pStrGiven,char *pStrAdd)

{
  size_t sVar1;
  size_t sVar2;
  char *local_20;
  char *pTemp;
  char *pStrAdd_local;
  char *pStrGiven_local;
  
  if (pStrGiven == (char *)0x0) {
    local_20 = Extra_UtilStrsav(pStrAdd);
  }
  else {
    sVar1 = strlen(pStrGiven);
    sVar2 = strlen(pStrAdd);
    local_20 = (char *)malloc(sVar1 + sVar2 + 2);
    sprintf(local_20,"%s%s",pStrGiven,pStrAdd);
    if (pStrGiven != (char *)0x0) {
      free(pStrGiven);
    }
  }
  return local_20;
}

Assistant:

char * Extra_StringAppend( char * pStrGiven, char * pStrAdd )
{
    char * pTemp;
    if ( pStrGiven )
    {
        pTemp = ABC_ALLOC( char, strlen(pStrGiven) + strlen(pStrAdd) + 2 );
        sprintf( pTemp, "%s%s", pStrGiven, pStrAdd );
        ABC_FREE( pStrGiven );
    }
    else
        pTemp = Extra_UtilStrsav( pStrAdd );
    return pTemp;
}